

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Request_Metrics(FT_Face face,FT_Size_Request req)

{
  FT_Size_Metrics *metrics;
  FT_Size_Request_Type FVar1;
  FT_Size pFVar2;
  FT_Error FVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong b_;
  long lVar10;
  long lVar11;
  
  pFVar2 = face->size;
  metrics = &pFVar2->metrics;
  if ((face->face_flags & 1) == 0) {
    (pFVar2->metrics).descender = 0;
    (pFVar2->metrics).height = 0;
    (pFVar2->metrics).y_scale = 0;
    (pFVar2->metrics).ascender = 0;
    metrics->x_ppem = 0;
    metrics->y_ppem = 0;
    *(undefined4 *)&metrics->field_0x4 = 0;
    (pFVar2->metrics).x_scale = 0;
    (pFVar2->metrics).max_advance = 0;
    (pFVar2->metrics).x_scale = 0x10000;
    (pFVar2->metrics).y_scale = 0x10000;
    goto LAB_00214415;
  }
  FVar1 = req->type;
  switch(FVar1) {
  case FT_SIZE_REQUEST_TYPE_NOMINAL:
    b_ = (ulong)face->units_per_EM;
    uVar4 = b_;
    goto LAB_00214222;
  case FT_SIZE_REQUEST_TYPE_REAL_DIM:
    uVar4 = (long)face->ascender - (long)face->descender;
    uVar8 = uVar4;
    break;
  case FT_SIZE_REQUEST_TYPE_BBOX:
    uVar4 = (face->bbox).xMax - (face->bbox).xMin;
    uVar8 = (face->bbox).yMax - (face->bbox).yMin;
    break;
  case FT_SIZE_REQUEST_TYPE_CELL:
    uVar4 = (ulong)face->max_advance_width;
    uVar8 = (long)face->ascender - (long)face->descender;
    break;
  case FT_SIZE_REQUEST_TYPE_SCALES:
    uVar8 = req->width;
    (pFVar2->metrics).x_scale = uVar8;
    uVar4 = req->height;
    (pFVar2->metrics).y_scale = uVar4;
    if (uVar8 == 0) goto LAB_00214395;
    if (uVar4 == 0) goto LAB_00214386;
    goto LAB_0021439c;
  default:
    b_ = 0;
    uVar4 = 0;
    goto LAB_00214222;
  }
  b_ = -uVar4;
  if (0 < (long)uVar4) {
    b_ = uVar4;
  }
  uVar4 = -uVar8;
  if (0 < (long)uVar8) {
    uVar4 = uVar8;
  }
LAB_00214222:
  lVar11 = req->width;
  lVar10 = lVar11;
  if ((ulong)req->horiResolution != 0) {
    lVar5 = (ulong)req->horiResolution * lVar11 + 0x24;
    lVar10 = lVar5 >> 0x3f;
    lVar10 = (lVar5 / 0x12 + lVar10 >> 2) - lVar10;
  }
  lVar5 = req->height;
  lVar9 = lVar5;
  if ((ulong)req->vertResolution != 0) {
    lVar6 = (ulong)req->vertResolution * lVar5 + 0x24;
    lVar9 = lVar6 >> 0x3f;
    lVar9 = (lVar6 / 0x12 + lVar9 >> 2) - lVar9;
  }
  if (lVar11 == 0 || lVar5 != 0) {
    if (uVar4 == 0) {
      return 0x85;
    }
    lVar6 = -lVar9;
    if (0 < lVar9) {
      lVar6 = lVar9;
    }
    uVar7 = ((uVar4 >> 1) + lVar6 * 0x10000) / uVar4;
    uVar8 = -uVar7;
    if (-1 < lVar9) {
      uVar8 = uVar7;
    }
    (pFVar2->metrics).y_scale = uVar8;
    if (lVar11 != 0) goto LAB_002142cc;
    uVar8 = (pFVar2->metrics).y_scale;
    (pFVar2->metrics).x_scale = uVar8;
    lVar10 = FT_MulDiv(lVar9,b_,uVar4);
  }
  else {
LAB_002142cc:
    if (b_ == 0) {
      return 0x85;
    }
    lVar11 = -lVar10;
    if (0 < lVar10) {
      lVar11 = lVar10;
    }
    uVar7 = ((b_ >> 1) + lVar11 * 0x10000) / b_;
    uVar8 = -uVar7;
    if (-1 < lVar10) {
      uVar8 = uVar7;
    }
    (pFVar2->metrics).x_scale = uVar8;
  }
  if (lVar5 == 0) {
    (pFVar2->metrics).y_scale = uVar8;
    lVar9 = FT_MulDiv(lVar10,uVar4,b_);
  }
  if (FVar1 != FT_SIZE_REQUEST_TYPE_NOMINAL) {
    if (FVar1 == FT_SIZE_REQUEST_TYPE_CELL) {
      uVar4 = (pFVar2->metrics).y_scale;
      if ((long)uVar8 < (long)uVar4) {
LAB_00214386:
        uVar4 = uVar8;
        (pFVar2->metrics).y_scale = uVar4;
        uVar8 = uVar4;
      }
      else {
LAB_00214395:
        (pFVar2->metrics).x_scale = uVar4;
        uVar8 = uVar4;
      }
    }
    else {
      uVar4 = (pFVar2->metrics).y_scale;
    }
LAB_0021439c:
    lVar11 = (long)(int)uVar8 * (ulong)face->units_per_EM;
    lVar10 = lVar11 + 0x8000 + (lVar11 >> 0x3f) >> 0x10;
    lVar11 = (long)(int)uVar4 * (ulong)face->units_per_EM;
    lVar9 = lVar11 + 0x8000 + (lVar11 >> 0x3f) >> 0x10;
  }
  lVar11 = lVar10 + 0x20 >> 6;
  FVar3 = 0x17;
  if ((lVar11 < 0x10000) && (lVar10 = lVar9 + 0x20 >> 6, lVar10 < 0x10000)) {
    (pFVar2->metrics).x_ppem = (FT_UShort)lVar11;
    (pFVar2->metrics).y_ppem = (FT_UShort)lVar10;
    ft_recompute_scaled_metrics(face,metrics);
LAB_00214415:
    FVar3 = 0;
  }
  return FVar3;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Request_Metrics( FT_Face          face,
                      FT_Size_Request  req )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Size_Metrics*  metrics;


    metrics = &face->size->metrics;

    if ( FT_IS_SCALABLE( face ) )
    {
      FT_Long  w = 0, h = 0, scaled_w = 0, scaled_h = 0;


      switch ( req->type )
      {
      case FT_SIZE_REQUEST_TYPE_NOMINAL:
        w = h = face->units_per_EM;
        break;

      case FT_SIZE_REQUEST_TYPE_REAL_DIM:
        w = h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_BBOX:
        w = face->bbox.xMax - face->bbox.xMin;
        h = face->bbox.yMax - face->bbox.yMin;
        break;

      case FT_SIZE_REQUEST_TYPE_CELL:
        w = face->max_advance_width;
        h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_SCALES:
        metrics->x_scale = (FT_Fixed)req->width;
        metrics->y_scale = (FT_Fixed)req->height;
        if ( !metrics->x_scale )
          metrics->x_scale = metrics->y_scale;
        else if ( !metrics->y_scale )
          metrics->y_scale = metrics->x_scale;
        goto Calculate_Ppem;

      case FT_SIZE_REQUEST_TYPE_MAX:
        break;
      }

      /* to be on the safe side */
      if ( w < 0 )
        w = -w;

      if ( h < 0 )
        h = -h;

      scaled_w = FT_REQUEST_WIDTH ( req );
      scaled_h = FT_REQUEST_HEIGHT( req );

      /* determine scales */
      if ( req->height || !req->width )
      {
        if ( h == 0 )
        {
          FT_ERROR(( "FT_Request_Metrics: Divide by zero\n" ));
          error = FT_ERR( Divide_By_Zero );
          goto Exit;
        }

        metrics->y_scale = FT_DivFix( scaled_h, h );
      }

      if ( req->width )
      {
        if ( w == 0 )
        {
          FT_ERROR(( "FT_Request_Metrics: Divide by zero\n" ));
          error = FT_ERR( Divide_By_Zero );
          goto Exit;
        }

        metrics->x_scale = FT_DivFix( scaled_w, w );
      }
      else
      {
        metrics->x_scale = metrics->y_scale;
        scaled_w = FT_MulDiv( scaled_h, w, h );
      }

      if ( !req->height )
      {
        metrics->y_scale = metrics->x_scale;
        scaled_h = FT_MulDiv( scaled_w, h, w );
      }

      if ( req->type == FT_SIZE_REQUEST_TYPE_CELL )
      {
        if ( metrics->y_scale > metrics->x_scale )
          metrics->y_scale = metrics->x_scale;
        else
          metrics->x_scale = metrics->y_scale;
      }

  Calculate_Ppem:
      /* calculate the ppems */
      if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      {
        scaled_w = FT_MulFix( face->units_per_EM, metrics->x_scale );
        scaled_h = FT_MulFix( face->units_per_EM, metrics->y_scale );
      }

      scaled_w = ( scaled_w + 32 ) >> 6;
      scaled_h = ( scaled_h + 32 ) >> 6;
      if ( scaled_w > (FT_Long)FT_USHORT_MAX ||
           scaled_h > (FT_Long)FT_USHORT_MAX )
      {
        FT_ERROR(( "FT_Request_Metrics: Resulting ppem size too large\n" ));
        error = FT_ERR( Invalid_Pixel_Size );
        goto Exit;
      }

      metrics->x_ppem = (FT_UShort)scaled_w;
      metrics->y_ppem = (FT_UShort)scaled_h;

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      FT_ZERO( metrics );
      metrics->x_scale = 1L << 16;
      metrics->y_scale = 1L << 16;
    }

  Exit:
    return error;
  }